

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FANSFrequencysatchannel.c
# Opt level: O3

int FANSFrequencysatchannel_constraint
              (asn_TYPE_descriptor_t *td,void *sptr,asn_app_constraint_failed_f *ctfailcb,
              void *app_key)

{
  char *pcVar1;
  ulong uVar2;
  char *pcVar3;
  undefined4 uVar4;
  
  if (sptr == (void *)0x0) {
    if (ctfailcb == (asn_app_constraint_failed_f *)0x0) {
      return -1;
    }
    pcVar3 = td->name;
    uVar4 = 0x2b;
    pcVar1 = "%s: value not given (%s:%d)";
    sptr = (void *)0x0;
  }
  else {
    if (*(int *)((long)sptr + 8) == 0xc) {
      uVar2 = 0xffffffffffffffff;
      while (permitted_alphabet_table_1[*(byte *)(*sptr + 1 + uVar2)] != 0) {
        uVar2 = uVar2 + 1;
        if (10 < uVar2) {
          return 0;
        }
      }
    }
    if (ctfailcb == (asn_app_constraint_failed_f *)0x0) {
      return -1;
    }
    pcVar3 = td->name;
    uVar4 = 0x38;
    pcVar1 = "%s: constraint failed (%s:%d)";
  }
  (*ctfailcb)(app_key,td,sptr,pcVar1,pcVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/szpajder[P]libacars/libacars/asn1/FANSFrequencysatchannel.c"
              ,uVar4);
  return -1;
}

Assistant:

int
FANSFrequencysatchannel_constraint(asn_TYPE_descriptor_t *td, const void *sptr,
			asn_app_constraint_failed_f *ctfailcb, void *app_key) {
	const NumericString_t *st = (const NumericString_t *)sptr;
	size_t size;
	
	if(!sptr) {
		ASN__CTFAIL(app_key, td, sptr,
			"%s: value not given (%s:%d)",
			td->name, __FILE__, __LINE__);
		return -1;
	}
	
	size = st->size;
	
	if((size == 12)
		 && !check_permitted_alphabet_1(st)) {
		/* Constraint check succeeded */
		return 0;
	} else {
		ASN__CTFAIL(app_key, td, sptr,
			"%s: constraint failed (%s:%d)",
			td->name, __FILE__, __LINE__);
		return -1;
	}
}